

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filecache.c
# Opt level: O0

tm * h2o_filecache_get_last_modified(h2o_filecache_ref_t *ref,char *outbuf)

{
  char *outbuf_local;
  h2o_filecache_ref_t *ref_local;
  
  if (ref->fd != -1) {
    if (*(char *)((long)&ref->field_3 + 200) == '\0') {
      gmtime_r((time_t *)((long)&ref->field_3 + 0x58),(tm *)&(ref->field_3).field_0._last_modified);
      h2o_time2str_rfc1123
                ((char *)((long)&ref->field_3 + 200),&(ref->field_3).field_0._last_modified.gm);
    }
    if (outbuf != (char *)0x0) {
      *(undefined8 *)outbuf = *(undefined8 *)((long)&ref->field_3 + 200);
      *(undefined8 *)(outbuf + 8) = *(undefined8 *)((long)&ref->field_3 + 0xd0);
      *(undefined8 *)(outbuf + 0x10) = *(undefined8 *)((long)&ref->field_3 + 0xd8);
      *(undefined4 *)(outbuf + 0x18) =
           *(undefined4 *)((ref->field_3).field_0._last_modified.str + 0x18);
      *(undefined2 *)(outbuf + 0x1c) = *(undefined2 *)((long)&ref->field_3 + 0xe4);
    }
    return (tm *)((long)&ref->field_3 + 0x90);
  }
  __assert_fail("ref->fd != -1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/lib/common/filecache.c"
                ,0x99,"struct tm *h2o_filecache_get_last_modified(h2o_filecache_ref_t *, char *)");
}

Assistant:

struct tm *h2o_filecache_get_last_modified(h2o_filecache_ref_t *ref, char *outbuf)
{
    assert(ref->fd != -1);
    if (ref->_last_modified.str[0] == '\0') {
        gmtime_r(&ref->st.st_mtime, &ref->_last_modified.gm);
        h2o_time2str_rfc1123(ref->_last_modified.str, &ref->_last_modified.gm);
    }
    if (outbuf != NULL)
        memcpy(outbuf, ref->_last_modified.str, H2O_TIMESTR_RFC1123_LEN + 1);
    return &ref->_last_modified.gm;
}